

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_lib.c
# Opt level: O0

int EC_POINT_dbl(EC_GROUP *group,EC_POINT *r,EC_POINT *a,BN_CTX *ctx)

{
  undefined4 local_4;
  
  if (*(long *)(*(long *)group + 0xb8) == 0) {
    local_4 = 0;
  }
  else if ((*(long *)group == *(long *)r) && (*(long *)r == *(long *)a)) {
    local_4 = (**(code **)(*(long *)group + 0xb8))(group,r,a,ctx);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int EC_POINT_dbl(const EC_GROUP *group, EC_POINT *r, const EC_POINT *a,
                 BN_CTX *ctx)
{
    if (group->meth->dbl == 0) {
        //ECerr(EC_F_EC_POINT_DBL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
        return 0;
    }
    if ((group->meth != r->meth) || (r->meth != a->meth)) {
        //ECerr(EC_F_EC_POINT_DBL, EC_R_INCOMPATIBLE_OBJECTS);
        return 0;
    }
    return group->meth->dbl(group, r, a, ctx);
}